

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::NeuralNetworkImageScaler::MergePartialFromCodedStream
          (NeuralNetworkImageScaler *this,CodedInputStream *input)

{
  byte *pbVar1;
  uint32 *value;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  uint32 uVar7;
  undefined8 in_RAX;
  int iVar8;
  char cVar9;
  ulong uVar10;
  int iVar11;
  undefined8 uStack_38;
  
  value = (uint32 *)((long)&uStack_38 + 4);
  uStack_38 = in_RAX;
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar10 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_00135594;
        uVar10 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = uVar10 | 0x100000000;
    }
    else {
LAB_00135594:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar10 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar7 | uVar10;
    }
    uVar7 = (uint32)uVar10;
    iVar11 = 6;
    iVar8 = iVar11;
    if ((uVar10 & 0x100000000) == 0) goto LAB_00135424;
    uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (uVar6 == 0x1e) {
      if (cVar9 != -0xb) goto LAB_00135424;
      puVar4 = input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
        bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback(input,value);
        if (!bVar5) goto LAB_0013544b;
      }
      else {
        uStack_38 = CONCAT44(*(undefined4 *)puVar4,(undefined4)uStack_38);
        input->buffer_ = puVar4 + 4;
      }
      this->graybias_ = uStack_38._4_4_;
LAB_00135449:
      iVar8 = 0;
    }
    else if (uVar6 == 0x14) {
      if (cVar9 == -0x5b) {
        puVar4 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback(input,value);
          if (!bVar5) goto LAB_0013544b;
        }
        else {
          uStack_38 = CONCAT44(*(undefined4 *)puVar4,(undefined4)uStack_38);
          input->buffer_ = puVar4 + 4;
        }
        this->bluebias_ = uStack_38._4_4_;
        goto LAB_00135449;
      }
LAB_00135424:
      iVar8 = 7;
      if (((uVar7 & 7) != 4 && uVar7 != 0) &&
         (bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7), iVar8 = iVar11
         , bVar5)) goto LAB_00135449;
    }
    else {
      if (uVar6 == 0x15) {
        if (cVar9 == -0x53) {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback(input,value);
            if (!bVar5) goto LAB_0013544b;
          }
          else {
            uStack_38 = CONCAT44(*(undefined4 *)puVar4,(undefined4)uStack_38);
            input->buffer_ = puVar4 + 4;
          }
          this->greenbias_ = uStack_38._4_4_;
          goto LAB_00135449;
        }
        goto LAB_00135424;
      }
      if (uVar6 == 0x16) {
        if (cVar9 == -0x4b) {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback(input,value);
            if (!bVar5) goto LAB_0013544b;
          }
          else {
            uStack_38 = CONCAT44(*(undefined4 *)puVar4,(undefined4)uStack_38);
            input->buffer_ = puVar4 + 4;
          }
          this->redbias_ = uStack_38._4_4_;
          goto LAB_00135449;
        }
        goto LAB_00135424;
      }
      if ((uVar6 != 10) || (cVar9 != 'U')) goto LAB_00135424;
      puVar4 = input->buffer_;
      if (3 < *(int *)&input->buffer_end_ - (int)puVar4) {
        uStack_38 = CONCAT44(*(undefined4 *)puVar4,(undefined4)uStack_38);
        input->buffer_ = puVar4 + 4;
LAB_001354a2:
        this->channelscale_ = uStack_38._4_4_;
        goto LAB_00135449;
      }
      bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback(input,value);
      if (bVar5) goto LAB_001354a2;
    }
LAB_0013544b:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool NeuralNetworkImageScaler::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NeuralNetworkImageScaler)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // float channelScale = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(85u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &channelscale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float blueBias = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(165u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &bluebias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float greenBias = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(173u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &greenbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float redBias = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(181u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &redbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float grayBias = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(245u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &graybias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NeuralNetworkImageScaler)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NeuralNetworkImageScaler)
  return false;
#undef DO_
}